

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O0

bool __thiscall QHttpProtocolHandler::sendRequest(QHttpProtocolHandler *this)

{
  bool bVar1;
  NetworkError NVar2;
  bool bVar3;
  bool bVar4;
  QHttpNetworkRequest *request;
  QHttpNetworkReplyPrivate *pQVar5;
  QHttpNetworkRequestPrivate *pQVar6;
  char *s;
  qint64 qVar7;
  longlong *plVar8;
  QObject *pQVar9;
  qsizetype qVar10;
  QNonContiguousByteDevice *pQVar11;
  long lVar12;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  QNonContiguousByteDevice *uploadByteDevice_2;
  qint64 headerSize;
  qint64 currentWriteSize;
  char *readPointer;
  qint64 desiredReadSize;
  QSslSocket *sslSocket;
  qint64 socketBufferFill;
  QNonContiguousByteDevice *uploadByteDevice_1;
  QNonContiguousByteDevice *uploadByteDevice;
  QAuthenticator *auth;
  QHttpNetworkReplyPrivate *replyPrivate;
  qint64 currentReadSize;
  anon_class_8_1_3f8b973f encryptedBytesToWrite;
  qint64 socketWriteMaxSize;
  QUrl url;
  undefined4 in_stack_fffffffffffffcc8;
  ComponentFormattingOption in_stack_fffffffffffffccc;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffcd0;
  QHttpNetworkRequest *in_stack_fffffffffffffcd8;
  ConnectionType CVar13;
  QIODevice *in_stack_fffffffffffffce0;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffce8;
  QObject *obj;
  undefined4 in_stack_fffffffffffffcf8;
  NetworkError in_stack_fffffffffffffcfc;
  QHttpNetworkReply *in_stack_fffffffffffffd00;
  undefined1 uVar14;
  QIODevice *in_stack_fffffffffffffd08;
  QByteArray *pQVar15;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffd10;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffd18;
  bool local_2bc;
  bool local_2bb;
  bool local_2b9;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffd58;
  long local_298;
  QHttpNetworkConnectionChannel *in_stack_fffffffffffffd98;
  bool local_239;
  QDebug local_1e8;
  long local_1e0;
  long local_1d8;
  QSslSocket *local_1d0;
  longlong local_1c8 [13];
  Connection local_160 [4];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [56];
  undefined1 local_c8 [32];
  undefined1 local_a8 [56];
  undefined1 local_70 [24];
  QUrl local_58 [2];
  QUrl local_48;
  undefined1 local_40 [24];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(long *)(in_RDI + 0x10) = *(long *)(*(long *)(in_RDI + 8) + 0x38);
  if (*(long *)(in_RDI + 0x10) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
               (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QMessageLogger::warning
              (local_28,"QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
    local_239 = false;
    goto LAB_0030ccf6;
  }
  request = (QHttpNetworkRequest *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20);
  switch(request) {
  case (QHttpNetworkRequest *)0x0:
    bVar4 = QHttpNetworkConnectionChannel::ensureConnection(in_stack_fffffffffffffd98);
    uVar14 = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
    if (!bVar4) {
      local_239 = false;
      goto LAB_0030ccf6;
    }
    bVar4 = QHttpNetworkRequest::isPreConnect((QHttpNetworkRequest *)0x30bf31);
    if (bVar4) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20) = 0;
      pQVar5 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x30bf53);
      pQVar5->state = AllDoneState;
      QHttpNetworkConnectionChannel::allDone
                ((QHttpNetworkConnectionChannel *)in_stack_fffffffffffffd10);
      QHttpNetworkConnection::preConnectFinished((QHttpNetworkConnection *)0x30bf82);
      *(long *)(in_RDI + 0x10) = 0;
      local_239 = true;
      goto LAB_0030ccf6;
    }
    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x48) = 0;
    pQVar5 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x30bfc8);
    QHttpNetworkReplyPrivate::clear(in_stack_fffffffffffffcd0);
    QPointer<QHttpNetworkConnection>::operator=
              ((QPointer<QHttpNetworkConnection> *)in_stack_fffffffffffffcd0,
               (QHttpNetworkConnection *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QPointer<QHttpNetworkConnectionChannel>::operator=
              ((QPointer<QHttpNetworkConnectionChannel> *)in_stack_fffffffffffffcd0,
               (QHttpNetworkConnectionChannel *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pQVar6 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                       ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_stack_fffffffffffffcd0)
    ;
    pQVar5->autoDecompress = (bool)(pQVar6->autoDecompress & 1);
    pQVar5->pipeliningUsed = false;
    QHttpNetworkRequest::url(in_stack_fffffffffffffcd8);
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffccc);
    QUrl::userInfo((QFlags_conflict *)local_40);
    bVar4 = QString::isEmpty((QString *)0x30c0b4);
    local_2b9 = false;
    if (!bVar4) {
      local_2b9 = QHttpNetworkRequest::withCredentials((QHttpNetworkRequest *)0x30c0d6);
    }
    QString::~QString((QString *)0x30c0ef);
    QUrl::~QUrl(&local_48);
    if (local_2b9 != false) {
      local_58[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
      QHttpNetworkRequest::url(in_stack_fffffffffffffcd8);
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
                 in_stack_fffffffffffffccc);
      QUrl::userName((QFlags_conflict *)local_70);
      QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffcd8);
      bVar3 = ::operator!=((QString *)in_stack_fffffffffffffcd0,
                           (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
      ;
      bVar1 = false;
      bVar4 = false;
      local_2bb = true;
      if (!bVar3) {
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffccc);
        QUrl::password((QFlags_conflict *)local_a8);
        bVar1 = true;
        bVar4 = QString::isEmpty((QString *)0x30c223);
        local_2bc = false;
        bVar4 = !bVar4;
        if (bVar4) {
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
                     in_stack_fffffffffffffccc);
          QUrl::password((QFlags_conflict *)local_c8);
          QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffcd8);
          local_2bc = ::operator!=((QString *)in_stack_fffffffffffffcd0,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        }
        local_2bb = local_2bc;
      }
      if (bVar4) {
        QString::~QString((QString *)0x30c2c5);
        QString::~QString((QString *)0x30c2de);
      }
      if (bVar1) {
        QString::~QString((QString *)0x30c2f7);
      }
      QString::~QString((QString *)0x30c304);
      QString::~QString((QString *)0x30c311);
      if (local_2bb != false) {
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffccc);
        QUrl::userName((QFlags_conflict *)local_100);
        QAuthenticator::setUser
                  ((QAuthenticator *)in_stack_fffffffffffffcd0,
                   (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        QString::~QString((QString *)0x30c378);
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffccc);
        QUrl::password((QFlags_conflict *)local_120);
        QAuthenticator::setPassword
                  ((QAuthenticator *)in_stack_fffffffffffffcd0,
                   (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        QString::~QString((QString *)0x30c3d2);
        QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c3e3);
        QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c3fc);
        QHttpNetworkConnectionPrivate::indexOf(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        QHttpNetworkConnectionPrivate::copyCredentials
                  (in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                   (QAuthenticator *)in_stack_fffffffffffffd08,(bool)uVar14);
      }
      QString::QString((QString *)0x30c433);
      QUrl::setUserInfo((QString *)local_58,(ParsingMode)local_140);
      QString::~QString((QString *)0x30c457);
      QHttpNetworkRequest::setUrl
                ((QHttpNetworkRequest *)in_stack_fffffffffffffcd0,
                 (QUrl *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QUrl::~QUrl(local_58);
    }
    uVar14 = (undefined1)((ulong)in_stack_fffffffffffffd10 >> 0x38);
    bVar4 = QHttpNetworkRequest::withCredentials((QHttpNetworkRequest *)0x30c496);
    if (bVar4) {
      QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c4ad);
      QHttpNetworkConnectionPrivate::createAuthorization(in_stack_fffffffffffffd58,in_RDI,request);
    }
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c4e7);
    QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffcd0);
    QHttpNetworkRequestPrivate::header
              ((QHttpNetworkRequest *)in_stack_fffffffffffffd18,(bool)uVar14);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffcd0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QByteArray::~QByteArray((QByteArray *)0x30c53a);
    pQVar11 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x30c54f);
    if (pQVar11 == (QNonContiguousByteDevice *)0x0) {
      pQVar15 = *(QByteArray **)(in_RDI + 0x18);
      QByteArray::QByteArray((QByteArray *)0x30c606);
      std::exchange<QByteArray,QByteArray>
                ((QByteArray *)in_stack_fffffffffffffcd8,(QByteArray *)in_stack_fffffffffffffcd0);
      CVar13 = (ConnectionType)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      QIODevice::write(pQVar15);
      QByteArray::~QByteArray((QByteArray *)0x30c63f);
      QByteArray::~QByteArray((QByteArray *)0x30c64c);
      QMetaObject::invokeMethod<>
                ((QObject *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,CVar13);
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20) = 4;
      (**(code **)(*(long *)in_RDI + 0x20))();
    }
    else {
      QObject::connect((QObject *)local_160,(char *)pQVar11,(QObject *)"2readyRead()",
                       *(char **)(in_RDI + 8),0x3d5328);
      QMetaObject::Connection::~Connection(local_160);
      qVar7 = QHttpNetworkRequest::contentLength((QHttpNetworkRequest *)0x30c5b6);
      *(qint64 *)(*(long *)(in_RDI + 8) + 0x48) = qVar7;
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20) = 2;
      (**(code **)(*(long *)in_RDI + 0x20))();
    }
    break;
  case (QHttpNetworkRequest *)0x2:
    pQVar11 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x30c69c);
    if ((pQVar11 == (QNonContiguousByteDevice *)0x0) ||
       (*(long *)(*(long *)(in_RDI + 8) + 0x48) == *(long *)(*(long *)(in_RDI + 8) + 0x40))) {
      bVar4 = QByteArray::isEmpty((QByteArray *)0x30c6de);
      if (!bVar4) {
        pQVar15 = *(QByteArray **)(in_RDI + 0x18);
        QByteArray::QByteArray((QByteArray *)0x30c709);
        std::exchange<QByteArray,QByteArray>
                  ((QByteArray *)in_stack_fffffffffffffcd8,(QByteArray *)in_stack_fffffffffffffcd0);
        QIODevice::write(pQVar15);
        QByteArray::~QByteArray((QByteArray *)0x30c742);
        QByteArray::~QByteArray((QByteArray *)0x30c74f);
      }
      if (pQVar11 != (QNonContiguousByteDevice *)0x0) {
        QHttpNetworkReply::dataSendProgress
                  ((QHttpNetworkReply *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                   (qint64)in_stack_fffffffffffffcd8,(qint64)in_stack_fffffffffffffcd0);
      }
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20) = 4;
      (**(code **)(*(long *)in_RDI + 0x20))();
    }
    else {
      local_1c8[0] = 0x4000;
      local_1d0 = qobject_cast<QSslSocket*>((QObject *)0x30c7c2);
      do {
        s = (char *)(**(code **)(**(long **)(in_RDI + 0x18) + 0xa8))();
        qVar7 = sendRequest::anon_class_8_1_3f8b973f::operator()
                          ((anon_class_8_1_3f8b973f *)in_stack_fffffffffffffcd0);
        NVar2 = in_stack_fffffffffffffcfc & 0xffffff;
        if ((long)(s + qVar7) < 0x8001) {
          NVar2 = CONCAT13(*(long *)(*(long *)(in_RDI + 8) + 0x48) !=
                           *(long *)(*(long *)(in_RDI + 8) + 0x40),(int3)in_stack_fffffffffffffcfc);
        }
        in_stack_fffffffffffffcfc = NVar2;
        if ((char)(in_stack_fffffffffffffcfc >> 0x18) == '\0') goto LAB_0030ccee;
        local_1d8 = 0;
        local_1e0 = *(long *)(*(long *)(in_RDI + 8) + 0x48) -
                    *(long *)(*(long *)(in_RDI + 8) + 0x40);
        plVar8 = qMin<long_long>(local_1c8,&local_1e0);
        lVar12 = (**(code **)(*(long *)pQVar11 + 0x60))(pQVar11,*plVar8,&local_1d8);
        if (local_1d8 == -1) {
          QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c8e1);
          QHttpNetworkConnectionPrivate::emitReplyError
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcfc);
          local_239 = false;
          goto LAB_0030ccf6;
        }
        if ((lVar12 == 0) || (local_1d8 == 0)) goto LAB_0030ccee;
        obj = *(QObject **)(*(long *)(in_RDI + 8) + 0x40);
        pQVar9 = (QObject *)(**(code **)(*(long *)pQVar11 + 0x78))();
        if (obj != pQVar9) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
                     (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          QMessageLogger::warning();
          QDebug::operator<<((QDebug *)obj,(char *)in_stack_fffffffffffffd18);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffcd0,
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          QDebug::operator<<((QDebug *)obj,(char *)in_stack_fffffffffffffd18);
          (**(code **)(*(long *)pQVar11 + 0x78))();
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffcd0,
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          QDebug::~QDebug(&local_1e8);
          QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30c9fe);
          QHttpNetworkConnectionPrivate::emitReplyError
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcfc);
          local_239 = false;
          goto LAB_0030ccf6;
        }
        bVar4 = QByteArray::isEmpty((QByteArray *)0x30ca4b);
        if (bVar4) {
          local_298 = QIODevice::write(*(char **)(in_RDI + 0x18),lVar12);
        }
        else {
          qVar10 = QByteArray::size((QByteArray *)(in_RDI + 0x28));
          QByteArray::append((QByteArray *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),s,
                             (qsizetype)obj);
          in_stack_fffffffffffffcd8 = *(QHttpNetworkRequest **)(in_RDI + 0x18);
          in_stack_fffffffffffffcd0 = (QHttpNetworkReplyPrivate *)(in_RDI + 0x28);
          QByteArray::QByteArray((QByteArray *)0x30cae0);
          std::exchange<QByteArray,QByteArray>
                    ((QByteArray *)in_stack_fffffffffffffcd8,(QByteArray *)in_stack_fffffffffffffcd0
                    );
          local_298 = QIODevice::write((QByteArray *)in_stack_fffffffffffffcd8);
          QByteArray::~QByteArray((QByteArray *)0x30cb21);
          QByteArray::~QByteArray((QByteArray *)0x30cb2e);
          if (local_298 != -1) {
            local_298 = local_298 - qVar10;
          }
          QMetaObject::invokeMethod<>
                    (obj,(char *)in_stack_fffffffffffffce0,
                     (ConnectionType)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
        }
        if ((local_298 == -1) || (local_298 != local_1d8)) {
          QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x30cb9f);
          QHttpNetworkConnectionPrivate::emitReplyError
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcfc);
          local_239 = false;
          goto LAB_0030ccf6;
        }
        *(long *)(*(long *)(in_RDI + 8) + 0x40) =
             local_298 + *(long *)(*(long *)(in_RDI + 8) + 0x40);
        (**(code **)(*(long *)pQVar11 + 0x68))(pQVar11,local_298);
        QHttpNetworkReply::dataSendProgress
                  ((QHttpNetworkReply *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                   (qint64)in_stack_fffffffffffffcd8,(qint64)in_stack_fffffffffffffcd0);
      } while (*(long *)(*(long *)(in_RDI + 8) + 0x40) != *(long *)(*(long *)(in_RDI + 8) + 0x48));
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20) = 4;
      (**(code **)(*(long *)in_RDI + 0x20))();
    }
    break;
  case (QHttpNetworkRequest *)0x4:
    pQVar11 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x30cc76);
    CVar13 = (ConnectionType)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
    if (pQVar11 != (QNonContiguousByteDevice *)0x0) {
      QObject::disconnect((QObject *)pQVar11,"2readyRead()",*(QObject **)(in_RDI + 8),
                          "1_q_uploadDataReadyRead()");
    }
    lVar12 = (**(code **)(**(long **)(in_RDI + 0x18) + 0xa0))();
    if (lVar12 != 0) {
      QMetaObject::invokeMethod<>
                ((QObject *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,CVar13);
    }
    break;
  case (QHttpNetworkRequest *)0x8:
  default:
  }
LAB_0030ccee:
  local_239 = true;
LAB_0030ccf6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_239;
}

Assistant:

bool QHttpProtocolHandler::sendRequest()
{
    m_reply = m_channel->reply;

    if (!m_reply) {
        // heh, how should that happen!
        qWarning("QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
        return false;
    }

    switch (m_channel->state) {
    case QHttpNetworkConnectionChannel::IdleState: { // write the header
        if (!m_channel->ensureConnection()) {
            // wait for the connection (and encryption) to be done
            // sendRequest will be called again from either
            // _q_connected or _q_encrypted
            return false;
        }
        if (m_channel->request.isPreConnect()) {
            m_channel->state = QHttpNetworkConnectionChannel::IdleState;
            m_reply->d_func()->state = QHttpNetworkReplyPrivate::AllDoneState;
            m_channel->allDone();
            m_connection->preConnectFinished(); // will only decrease the counter
            m_reply = nullptr; // so we can reuse this channel
            return true; // we have a working connection and are done
        }

        m_channel->written = 0; // excluding the header
        m_channel->bytesTotal = 0;

        QHttpNetworkReplyPrivate *replyPrivate = m_reply->d_func();
        replyPrivate->clear();
        replyPrivate->connection = m_connection;
        replyPrivate->connectionChannel = m_channel;
        replyPrivate->autoDecompress = m_channel->request.d->autoDecompress;
        replyPrivate->pipeliningUsed = false;

        // if the url contains authentication parameters, use the new ones
        // both channels will use the new authentication parameters
        if (!m_channel->request.url().userInfo().isEmpty() && m_channel->request.withCredentials()) {
            QUrl url = m_channel->request.url();
            QAuthenticator &auth = m_channel->authenticator;
            if (url.userName() != auth.user()
                || (!url.password().isEmpty() && url.password() != auth.password())) {
                auth.setUser(url.userName());
                auth.setPassword(url.password());
                m_connection->d_func()->copyCredentials(m_connection->d_func()->indexOf(m_socket), &auth, false);
            }
            // clear the userinfo,  since we use the same request for resending
            // userinfo in url can conflict with the one in the authenticator
            url.setUserInfo(QString());
            m_channel->request.setUrl(url);
        }
        // Will only be false if Qt WebKit is performing a cross-origin XMLHttpRequest
        // and withCredentials has not been set to true.
        if (m_channel->request.withCredentials())
            m_connection->d_func()->createAuthorization(m_socket, m_channel->request);
#ifndef QT_NO_NETWORKPROXY
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request,
            (m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy));
#else
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request, false);
#endif

        // flushing is dangerous (QSslSocket calls transmit which might read or error)
//        m_socket->flush();
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            // connect the signals so this function gets called again
            QObject::connect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));

            m_channel->bytesTotal = m_channel->request.contentLength();

            m_channel->state = QHttpNetworkConnectionChannel::WritingState; // start writing data
            sendRequest(); //recurse
        } else {
            // no data to send: just send the HTTP headers
            m_socket->write(std::exchange(m_header, {}));
            QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); //recurse
        }

        break;
    }
    case QHttpNetworkConnectionChannel::WritingState:
    {
        // write the data
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (!uploadByteDevice || m_channel->bytesTotal == m_channel->written) {
            // the upload device might have no data to send, but we still have to send the headers,
            // do it now.
            if (!m_header.isEmpty())
                m_socket->write(std::exchange(m_header, {}));
            if (uploadByteDevice)
                emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); // recurse
            break;
        }

        // only feed the QTcpSocket buffer when there is less than 32 kB in it;
        // note that the headers do not count towards these limits.
        const qint64 socketBufferFill = 32*1024;
        const qint64 socketWriteMaxSize = 16*1024;

        // if it is really an ssl socket, check more than just bytesToWrite()
#ifndef QT_NO_SSL
        QSslSocket *sslSocket = qobject_cast<QSslSocket*>(m_socket);
        const auto encryptedBytesToWrite = [sslSocket]() -> qint64
        {
            return sslSocket ? sslSocket->encryptedBytesToWrite() : 0;
        };
#else
        const auto encryptedBytesToWrite = [](){ return qint64(0); };
#endif

        // throughout this loop, we want to send the data coming from uploadByteDevice.
        // we also need to send the headers, as we try to coalesce their write with the data.
        // we won't send more than the limits above, excluding the headers
        while ((m_socket->bytesToWrite() + encryptedBytesToWrite()) <= socketBufferFill
               && m_channel->bytesTotal != m_channel->written)
        {
            // get pointer to upload data
            qint64 currentReadSize = 0;
            const qint64 desiredReadSize = qMin(socketWriteMaxSize, m_channel->bytesTotal - m_channel->written);
            const char *readPointer = uploadByteDevice->readPointer(desiredReadSize, currentReadSize);

            if (currentReadSize == -1) {
                // premature eof happened
                m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                return false;
            } else if (readPointer == nullptr || currentReadSize == 0) {
                // nothing to read currently, break the loop
                break;
            } else {
                if (m_channel->written != uploadByteDevice->pos()) {
                    // Sanity check. This was useful in tracking down an upload corruption.
                    qWarning() << "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position" << m_channel->written << "but read device is at" << uploadByteDevice->pos();
                    Q_ASSERT(m_channel->written == uploadByteDevice->pos());
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::ProtocolFailure);
                    return false;
                }
                qint64 currentWriteSize;
                if (m_header.isEmpty()) {
                    currentWriteSize = m_socket->write(readPointer, currentReadSize);
                } else {
                    // assemble header and data and send them together
                    const qint64 headerSize = m_header.size();
                    m_header.append(readPointer, currentReadSize);
                    currentWriteSize = m_socket->write(std::exchange(m_header, {}));
                    if (currentWriteSize != -1)
                        currentWriteSize -= headerSize;
                    QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
                }
                if (currentWriteSize == -1 || currentWriteSize != currentReadSize) {
                    // socket broke down
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                    return false;
                } else {
                    m_channel->written += currentWriteSize;
                    uploadByteDevice->advanceReadPointer(currentWriteSize);

                    emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);

                    if (m_channel->written == m_channel->bytesTotal) {
                        // make sure this function is called once again
                        m_channel->state = QHttpNetworkConnectionChannel::WaitingState;
                        sendRequest();
                        break;
                    }
                }
            }
        }
        break;
    }

    case QHttpNetworkConnectionChannel::WaitingState:
    {
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            QObject::disconnect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));
        }

        // HTTP pipelining
        //m_connection->d_func()->fillPipeline(m_socket);
        //m_socket->flush();

        // ensure we try to receive a reply in all cases, even if _q_readyRead_ hat not been called
        // this is needed if the sends an reply before we have finished sending the request. In that
        // case receiveReply had been called before but ignored the server reply
        if (m_socket->bytesAvailable())
            QMetaObject::invokeMethod(m_channel, "_q_receiveReply", Qt::QueuedConnection);
        break;
    }
    case QHttpNetworkConnectionChannel::ReadingState:
        // ignore _q_bytesWritten in these states
        Q_FALLTHROUGH();
    default:
        break;
    }
    return true;
}